

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::SelectConstant<int,_int,_duckdb::GreaterThan>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  int *left_00;
  int *right_00;
  SelectionVector *in_RCX;
  SelectionVector *in_RDX;
  long in_R8;
  idx_t in_R9;
  idx_t i_1;
  idx_t i;
  int *rdata;
  int *ldata;
  idx_t in_stack_ffffffffffffff90;
  SelectionVector *pSVar2;
  idx_t in_stack_ffffffffffffff98;
  idx_t idx;
  SelectionVector *in_stack_ffffffffffffffa0;
  SelectionVector *local_58;
  SelectionVector *local_50;
  SelectionVector *local_8;
  
  left_00 = ConstantVector::GetData<int>((Vector *)0x2ed5fec);
  right_00 = ConstantVector::GetData<int>((Vector *)0x2ed5ffb);
  bVar1 = ConstantVector::IsNull((Vector *)0x2ed600a);
  if (((bVar1) || (bVar1 = ConstantVector::IsNull((Vector *)0x2ed6018), bVar1)) ||
     (bVar1 = GreaterThan::Operation<int>(left_00,right_00), !bVar1)) {
    if (in_R9 != 0) {
      for (local_50 = (SelectionVector *)0x0; local_50 < in_RCX;
          local_50 = (SelectionVector *)((long)&local_50->sel_vector + 1)) {
        idx = in_R9;
        pSVar2 = local_50;
        SelectionVector::get_index(in_RDX,(idx_t)local_50);
        SelectionVector::set_index(pSVar2,idx,in_stack_ffffffffffffff90);
      }
    }
    local_8 = (SelectionVector *)0x0;
  }
  else {
    local_8 = in_RCX;
    if (in_R8 != 0) {
      for (local_58 = (SelectionVector *)0x0; local_58 < in_RCX;
          local_58 = (SelectionVector *)((long)&local_58->sel_vector + 1)) {
        pSVar2 = local_58;
        SelectionVector::get_index(in_RDX,(idx_t)local_58);
        SelectionVector::set_index
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(idx_t)pSVar2);
      }
    }
  }
  return (idx_t)local_8;
}

Assistant:

static idx_t SelectConstant(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                            SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);

		// both sides are constant, return either 0 or the count
		// in this case we do not fill in the result selection vector at all
		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right) || !OP::Operation(*ldata, *rdata)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		} else {
			if (true_sel) {
				for (idx_t i = 0; i < count; i++) {
					true_sel->set_index(i, sel->get_index(i));
				}
			}
			return count;
		}
	}